

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  int iVar1;
  secp256k1_ge *in_RSI;
  size_t i;
  secp256k1_fe dqy;
  secp256k1_fe dqx;
  secp256k1_fe dpy;
  secp256k1_fe dpx;
  secp256k1_ge gg;
  secp256k1_ge q;
  secp256k1_ge p;
  secp256k1_gej g2;
  undefined5 in_stack_fffffffffffffdb8;
  byte in_stack_fffffffffffffdbd;
  byte in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  byte bVar2;
  secp256k1_gej *in_stack_fffffffffffffdc0;
  secp256k1_ge *r;
  undefined1 local_238 [16];
  secp256k1_fe *in_stack_fffffffffffffdd8;
  secp256k1_fe *in_stack_fffffffffffffde0;
  secp256k1_gej *in_stack_fffffffffffffe08;
  secp256k1_ge *in_stack_fffffffffffffe10;
  secp256k1_fe local_1e8;
  secp256k1_fe local_1c0;
  secp256k1_fe local_198;
  secp256k1_fe sStack_170;
  secp256k1_fe local_140;
  undefined1 auStack_118 [48];
  secp256k1_fe local_e8;
  secp256k1_fe asStack_c0 [4];
  secp256k1_ge *local_10;
  
  if (in_RSI == (secp256k1_ge *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1040,"test condition failed: 0 < n");
    abort();
  }
  local_10 = in_RSI;
  secp256k1_ge_from_storage
            ((secp256k1_ge *)in_stack_fffffffffffffdc0,
             (secp256k1_ge_storage *)
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT15(in_stack_fffffffffffffdbd,in_stack_fffffffffffffdb8))));
  iVar1 = secp256k1_ge_is_valid_var((secp256k1_ge *)in_stack_fffffffffffffe08);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1043,"test condition failed: secp256k1_ge_is_valid_var(&p)");
    abort();
  }
  secp256k1_gej_set_ge
            (in_stack_fffffffffffffdc0,
             (secp256k1_ge *)
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT15(in_stack_fffffffffffffdbd,in_stack_fffffffffffffdb8))));
  secp256k1_gej_double_var
            (in_stack_fffffffffffffdc0,
             (secp256k1_gej *)
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT15(in_stack_fffffffffffffdbd,in_stack_fffffffffffffdb8))),
             (secp256k1_fe *)0x13796b);
  secp256k1_ge_set_gej_var(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  r = (secp256k1_ge *)0x1;
  while( true ) {
    if (local_10 <= r) {
      return;
    }
    secp256k1_fe_impl_negate_unchecked(&local_1c0,&local_e8,1);
    secp256k1_fe_impl_add(&local_1c0,&local_198);
    secp256k1_fe_impl_normalize_weak(&local_1c0);
    secp256k1_fe_impl_negate_unchecked(&local_1e8,asStack_c0,1);
    secp256k1_fe_impl_add(&local_1e8,&sStack_170);
    secp256k1_fe_impl_normalize_weak(&local_1e8);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_1c0);
    bVar2 = 1;
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_1e8);
      bVar2 = iVar1 != 0 ^ 0xff;
    }
    if (((bVar2 ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x104c,
              "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy)"
             );
      abort();
    }
    secp256k1_ge_from_storage
              (r,(secp256k1_ge_storage *)
                 CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffdbe,
                                         CONCAT15(in_stack_fffffffffffffdbd,
                                                  in_stack_fffffffffffffdb8))));
    iVar1 = secp256k1_ge_is_valid_var((secp256k1_ge *)in_stack_fffffffffffffe08);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x104f,"test condition failed: secp256k1_ge_is_valid_var(&q)");
      abort();
    }
    secp256k1_fe_impl_negate_unchecked((secp256k1_fe *)&stack0xfffffffffffffdf0,&local_140,1);
    secp256k1_fe_impl_add((secp256k1_fe *)&stack0xfffffffffffffdf0,&local_198);
    memcpy(local_238,auStack_118,0x28);
    secp256k1_fe_impl_add((secp256k1_fe *)local_238,&sStack_170);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)&stack0xfffffffffffffdf0);
    in_stack_fffffffffffffdbe = 1;
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)local_238);
      in_stack_fffffffffffffdbe = iVar1 != 0 ^ 0xff;
    }
    if (((in_stack_fffffffffffffdbe ^ 0xff) & 1) != 0) break;
    iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdbd = 1;
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffdbd = iVar1 != 0 ^ 0xff;
    }
    if (((in_stack_fffffffffffffdbd ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1057,
              "test condition failed: !secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy)"
             );
      abort();
    }
    secp256k1_fe_impl_mul
              (&r->x,(secp256k1_fe *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffdbe,
                                             CONCAT15(in_stack_fffffffffffffdbd,
                                                      in_stack_fffffffffffffdb8))),
               (secp256k1_fe *)0x137c6b);
    secp256k1_fe_impl_mul
              (&r->x,(secp256k1_fe *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffdbe,
                                             CONCAT15(in_stack_fffffffffffffdbd,
                                                      in_stack_fffffffffffffdb8))),
               (secp256k1_fe *)0x137c7d);
    iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x105c,"test condition failed: secp256k1_fe_equal(&dpx, &dpy)");
      abort();
    }
    memcpy(&local_e8,&local_140,0x58);
    r = (secp256k1_ge *)((long)(r->x).n + 1);
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x1054,
          "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy)"
         );
  abort();
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}